

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libasd_py.cpp
# Opt level: O1

PyObject * PyInit_libasd(void)

{
  int iVar1;
  char *__s1;
  module_ m;
  handle local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  __s1 = (char *)Py_GetVersion();
  iVar1 = strncmp(__s1,"3.10",4);
  if ((iVar1 == 0) && (9 < (byte)(__s1[4] - 0x30U))) {
    pybind11::detail::get_internals();
    pybind11::module_::create_extension_module
              ((module_ *)&local_40,"libasd",(char *)0x0,&pybind11_module_def_libasd);
    local_38.obj.m_ptr = local_40.m_ptr;
    local_38.key = "__doc__";
    local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              (&local_38,(char (*) [53])"libasd -- library to read and write .asd format file");
    pybind11::object::~object(&local_38.cache);
    add_header_enums((module *)&local_40);
    add_header_classes((module *)&local_40);
    add_frame_headers((module *)&local_40);
    add_frame_data((module *)&local_40);
    add_frame_classes((module *)&local_40);
    add_data_classes((module *)&local_40);
    add_read_header((module *)&local_40);
    add_read_asd((module *)&local_40);
    pybind11::object::~object((object *)&local_40);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",__s1);
    local_40.m_ptr = (PyObject *)0x0;
  }
  return local_40.m_ptr;
}

Assistant:

PYBIND11_MODULE(libasd, mod)
{
    mod.doc() = "libasd -- library to read and write .asd format file";

    add_header_enums  (mod);
    add_header_classes(mod);
    add_frame_headers (mod);
    add_frame_data    (mod);
    add_frame_classes (mod);
    add_data_classes  (mod);
    add_read_header   (mod);
    add_read_asd      (mod);
}